

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O3

PrettyPrinterNode * getFirstBadLine(PrettyPrinterNode *start,int line_length)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  PrettyPrinterNode *pPVar4;
  
  bVar3 = start->is_line_separator;
  if ((bool)bVar3 == true) {
    __assert_fail("!start->is_line_separator",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/LispPrint.cpp"
                  ,0x13c,"PrettyPrinterNode *getFirstBadLine(PrettyPrinterNode *, int)");
  }
  iVar2 = start->line;
  pPVar4 = start;
  do {
    if ((bVar3 & 1) == 0) {
      piVar1 = &pPVar4->line;
      if (*piVar1 != iVar2) {
        start = pPVar4;
      }
      if (line_length < pPVar4->offset) {
        return start;
      }
      pPVar4 = pPVar4->next;
      iVar2 = *piVar1;
      if (pPVar4 == (PrettyPrinterNode *)0x0) {
        return (PrettyPrinterNode *)0x0;
      }
    }
    else {
      pPVar4 = pPVar4->next;
      if (pPVar4 == (PrettyPrinterNode *)0x0) {
        __assert_fail("start->next",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/LispPrint.cpp"
                      ,0x141,"PrettyPrinterNode *getFirstBadLine(PrettyPrinterNode *, int)");
      }
    }
    bVar3 = pPVar4->is_line_separator;
  } while( true );
}

Assistant:

static PrettyPrinterNode* getFirstBadLine(PrettyPrinterNode* start, int line_length) {
  assert(!start->is_line_separator);
  int currentLine = start->line;
  auto* currentLineNode = start;
  for(;;) {
    if(start->is_line_separator) {
      assert(start->next);
      start = start->next;
    } else {
      if(start->line != currentLine) {
        currentLine = start->line;
        currentLineNode = start;
      }
      if(start->offset > line_length) {
        return currentLineNode;
      }
      if(!start->next) {
        return nullptr;
      }
      start = start->next;
    }
  }
}